

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::UDFWrapper::
CreateBinaryAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,int>
          (AggregateFunction *__return_storage_ptr__,UDFWrapper *this,string *name,
          LogicalType *ret_type,LogicalType *input_type_a,LogicalType *input_type_b)

{
  LogicalType *return_type;
  LogicalType local_40 [24];
  
  return_type = input_type_a;
  duckdb::LogicalType::LogicalType(local_40,(LogicalType *)name);
  AggregateFunction::
  BinaryAggregate<duckdb::udf_covar_state_t,double,int,double,duckdb::UDFCovarPopOperation,(duckdb::AggregateDestructorType)0>
            (__return_storage_ptr__,(AggregateFunction *)ret_type,input_type_a,local_40,return_type)
  ;
  duckdb::LogicalType::~LogicalType(local_40);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->field_0x8);
  return __return_storage_ptr__;
}

Assistant:

inline static AggregateFunction CreateBinaryAggregateFunction(const string &name, const LogicalType &ret_type,
	                                                              const LogicalType &input_type_a,
	                                                              const LogicalType &input_type_b) {
		AggregateFunction aggr_function =
		    AggregateFunction::BinaryAggregate<STATE, TA, TB, TR, UDF_OP>(input_type_a, input_type_b, ret_type);
		aggr_function.name = name;
		return aggr_function;
	}